

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

string_view __thiscall
Jupiter::IRC::Client::readConfigValue(Client *this,string_view key,string_view defaultValue)

{
  Config *this_00;
  string_view in_default_value;
  string_view in_key;
  string_view in_key_00;
  bool bVar1;
  string_view local_60;
  char *local_50;
  char *local_48;
  Client *local_40;
  Client *this_local;
  string_view defaultValue_local;
  string_view key_local;
  string_view val;
  
  defaultValue_local._M_len = (size_t)defaultValue._M_str;
  this_local = (Client *)defaultValue._M_len;
  key_local._M_len = (size_t)key._M_str;
  defaultValue_local._M_str = (char *)key._M_len;
  local_40 = this;
  if (this->m_primary_section != (Config *)0x0) {
    this_00 = this->m_primary_section;
    local_50 = defaultValue_local._M_str;
    local_48 = (char *)key_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
    in_key_00._M_str = local_48;
    in_key_00._M_len = (size_t)local_50;
    join_0x00000010_0x00000000_ = Config::get(this_00,in_key_00,local_60);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&key_local._M_str);
    if (!bVar1) {
      return stack0xffffffffffffffe8;
    }
  }
  if (this->m_secondary_section == (Config *)0x0) {
    val._M_len = defaultValue_local._M_len;
    key_local._M_str = (char *)this_local;
  }
  else {
    in_key._M_str = (char *)key_local._M_len;
    in_key._M_len = (size_t)defaultValue_local._M_str;
    in_default_value._M_str = (char *)defaultValue_local._M_len;
    in_default_value._M_len = (size_t)this_local;
    join_0x00000010_0x00000000_ = Config::get(this->m_secondary_section,in_key,in_default_value);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

std::string_view Jupiter::IRC::Client::readConfigValue(std::string_view key, std::string_view defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);
		if (!val.empty()) {
			return val;
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get(key, defaultValue);
	}

	return defaultValue;
}